

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void CumulativeSumToAverageRow_C(int32_t *tl,int32_t *bl,int w,int area,uint8_t *dst,int count)

{
  float fVar1;
  int i;
  float ooa;
  int count_local;
  uint8_t *dst_local;
  int area_local;
  int w_local;
  int32_t *bl_local;
  int32_t *tl_local;
  
  fVar1 = 1.0 / (float)area;
  dst_local = dst;
  bl_local = bl;
  tl_local = tl;
  for (i = 0; i < count; i = i + 1) {
    *dst_local = (uint8_t)(int)((float)(((bl_local[w] + *tl_local) - *bl_local) - tl_local[w]) *
                               fVar1);
    dst_local[1] = (uint8_t)(int)((float)(((bl_local[(long)w + 1] + tl_local[1]) - bl_local[1]) -
                                         tl_local[(long)w + 1]) * fVar1);
    dst_local[2] = (uint8_t)(int)((float)(((bl_local[(long)w + 2] + tl_local[2]) - bl_local[2]) -
                                         tl_local[(long)w + 2]) * fVar1);
    dst_local[3] = (uint8_t)(int)((float)(((bl_local[(long)w + 3] + tl_local[3]) - bl_local[3]) -
                                         tl_local[(long)w + 3]) * fVar1);
    dst_local = dst_local + 4;
    tl_local = tl_local + 4;
    bl_local = bl_local + 4;
  }
  return;
}

Assistant:

void CumulativeSumToAverageRow_C(const int32_t* tl,
                                 const int32_t* bl,
                                 int w,
                                 int area,
                                 uint8_t* dst,
                                 int count) {
  float ooa = 1.0f / area;
  int i;
  for (i = 0; i < count; ++i) {
    dst[0] = (uint8_t)((bl[w + 0] + tl[0] - bl[0] - tl[w + 0]) * ooa);
    dst[1] = (uint8_t)((bl[w + 1] + tl[1] - bl[1] - tl[w + 1]) * ooa);
    dst[2] = (uint8_t)((bl[w + 2] + tl[2] - bl[2] - tl[w + 2]) * ooa);
    dst[3] = (uint8_t)((bl[w + 3] + tl[3] - bl[3] - tl[w + 3]) * ooa);
    dst += 4;
    tl += 4;
    bl += 4;
  }
}